

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O2

RFile * open_existing_file(char *name,uint64_t *size,unsigned_long *mtime,unsigned_long *atime,
                          long *perms)

{
  FILE *__stream;
  int iVar1;
  RFile *pRVar2;
  int *piVar3;
  char *pcVar4;
  stat statbuf;
  
  pRVar2 = (RFile *)0x0;
  iVar1 = open(name,0);
  if (-1 < iVar1) {
    pRVar2 = (RFile *)safemalloc(1,4,0);
    pRVar2->fd = iVar1;
    if (((size != (uint64_t *)0x0 || mtime != (unsigned_long *)0x0) || atime != (unsigned_long *)0x0
        ) || perms != (long *)0x0) {
      iVar1 = fstat(iVar1,(stat *)&statbuf);
      __stream = _stderr;
      if (iVar1 < 0) {
        piVar3 = __errno_location();
        pcVar4 = strerror(*piVar3);
        fprintf(__stream,"%s: stat: %s\n",name,pcVar4);
        memset(&statbuf,0,0x90);
      }
      if (size != (uint64_t *)0x0) {
        *size = statbuf.st_size;
      }
      if (mtime != (unsigned_long *)0x0) {
        *mtime = statbuf.st_mtim.tv_sec;
      }
      if (atime != (unsigned_long *)0x0) {
        *atime = statbuf.st_atim.tv_sec;
      }
      if (perms != (long *)0x0) {
        *perms = (ulong)statbuf.st_mode;
      }
    }
  }
  return pRVar2;
}

Assistant:

RFile *open_existing_file(const char *name, uint64_t *size,
                          unsigned long *mtime, unsigned long *atime,
                          long *perms)
{
    int fd;
    RFile *ret;

    fd = open(name, O_RDONLY);
    if (fd < 0)
        return NULL;

    ret = snew(RFile);
    ret->fd = fd;

    if (size || mtime || atime || perms) {
        struct stat statbuf;
        if (fstat(fd, &statbuf) < 0) {
            fprintf(stderr, "%s: stat: %s\n", name, strerror(errno));
            memset(&statbuf, 0, sizeof(statbuf));
        }

        if (size)
            *size = statbuf.st_size;

        if (mtime)
            *mtime = statbuf.st_mtime;

        if (atime)
            *atime = statbuf.st_atime;

        if (perms)
            *perms = statbuf.st_mode;
    }

    return ret;
}